

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bool __thiscall KeyStore::load(KeyStore *this,MemBuffer *buf,string *param_2)

{
  uint uVar1;
  uint magic;
  string *param_2_local;
  MemBuffer *buf_local;
  KeyStore *this_local;
  
  uVar1 = asn1::MemBuffer::read<unsigned_int>(buf);
  if (uVar1 == 0xfeedfeed) {
    asn1::MemBuffer::operator=(&this->membuf,buf);
  }
  return uVar1 == 0xfeedfeed;
}

Assistant:

bool KeyStore::load(MemBuffer& buf, const std::string& /*pass*/)
{
    auto magic = buf.read<uint32_t>();
    if (magic != 0xfeedfeed)
        return false;
    // auto version = buf.read<uint32_t>();
    // auto count = buf.read<uint32_t>();

    membuf = buf;
    return true;
}